

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void ws_conn_cb(void *arg)

{
  nni_aio *pnVar1;
  long lVar2;
  nni_aio *aio;
  nng_err nVar3;
  int iVar4;
  uint32_t uVar5;
  void *pvVar6;
  int i;
  long lVar7;
  nni_mtx *mtx;
  uint8_t local_48 [8];
  uint8_t raw [16];
  
  lVar2 = *(long *)((long)arg + 0xa10);
  pnVar1 = (nni_aio *)((long)arg + 0x818);
  nVar3 = nni_aio_result(pnVar1);
  if (nVar3 == NNG_OK) {
    pvVar6 = nni_aio_get_output(pnVar1,0);
    *(void **)((long)arg + 0x9e8) = pvVar6;
    mtx = (nni_mtx *)((long)arg + 0x60);
    nni_mtx_lock(mtx);
    aio = *(nni_aio **)((long)arg + 0x9e0);
    nni_aio_set_output(pnVar1,0,(void *)0x0);
    if (aio != (nni_aio *)0x0) {
      lVar7 = 0;
      do {
        uVar5 = nni_random();
        local_48[lVar7] = (uint8_t)uVar5;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x10);
      nni_base64_encode(local_48,0x10,(char *)((long)arg + 0xa18),0x18);
      *(undefined1 *)((long)arg + 0xa30) = 0;
      nVar3 = nni_http_set_uri(*(nng_http **)((long)arg + 0x9e8),
                               *(char **)(*(long *)(lVar2 + 0xc0) + 0x20),
                               *(char **)(*(long *)(lVar2 + 0xc0) + 0x28));
      if (nVar3 == NNG_OK) {
        nni_http_set_static_header
                  (*(nng_http **)((long)arg + 0x9e8),(nni_http_header *)((long)arg + 0xa38),
                   "Connection","Upgrade");
        nni_http_set_static_header
                  (*(nng_http **)((long)arg + 0x9e8),(nni_http_header *)((long)arg + 0xa60),
                   "Upgrade","websocket");
        nni_http_set_static_header
                  (*(nng_http **)((long)arg + 0x9e8),(nni_http_header *)((long)arg + 0xab0),
                   "Sec-WebSocket-Key",(char *)((long)arg + 0xa18));
        nni_http_set_static_header
                  (*(nng_http **)((long)arg + 0x9e8),(nni_http_header *)((long)arg + 0xb00),
                   "Sec-WebSocket-Version","13");
        if (*(char **)(lVar2 + 0xb8) != (char *)0x0) {
          nni_http_set_static_header
                    (*(nng_http **)((long)arg + 0x9e8),(nni_http_header *)((long)arg + 0xad8),
                     "Sec-WebSocket-Protocol",*(char **)(lVar2 + 0xb8));
        }
        for (pvVar6 = nni_list_first((nni_list *)(lVar2 + 0xe8)); pvVar6 != (void *)0x0;
            pvVar6 = nni_list_next((nni_list *)(lVar2 + 0xe8),pvVar6)) {
          nVar3 = nni_http_set_header(*(nng_http **)((long)arg + 0x9e8),
                                      *(char **)((long)pvVar6 + 0x10),
                                      *(char **)((long)pvVar6 + 0x18));
          if (nVar3 != NNG_OK) goto LAB_0012e0b4;
        }
        nni_http_write_req(*(nng_http **)((long)arg + 0x9e8),(nni_aio *)((long)arg + 0x650));
        nni_mtx_unlock(mtx);
      }
      else {
LAB_0012e0b4:
        nni_aio_finish_error(aio,nVar3);
        nni_mtx_unlock(mtx);
        nni_reap(&ws_reap_list,arg);
      }
      return;
    }
  }
  else {
    nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
    pnVar1 = *(nni_aio **)((long)arg + 0x9e0);
    if (pnVar1 != (nni_aio *)0x0) {
      *(undefined8 *)((long)arg + 0x9e0) = 0;
      nni_aio_finish_error(pnVar1,nVar3);
    }
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
    mtx = (nni_mtx *)(lVar2 + 0x58);
    nni_mtx_lock(mtx);
    iVar4 = nni_list_node_active((nni_list_node *)((long)arg + 0x38));
    if (iVar4 == 0) {
      nni_mtx_unlock(mtx);
      return;
    }
    nni_list_remove((nni_list *)(lVar2 + 200),arg);
    *(undefined8 *)((long)arg + 0xa10) = 0;
    iVar4 = nni_list_empty((nni_list *)(lVar2 + 200));
    if (iVar4 != 0) {
      nni_cv_wake((nni_cv *)(lVar2 + 0x80));
    }
  }
  nni_mtx_unlock(mtx);
  nni_reap(&ws_reap_list,arg);
  return;
}

Assistant:

void
ws_conn_cb(void *arg)
{
	nni_ws_dialer *d;
	nni_ws        *ws;
	nni_aio       *uaio;
	int            rv;
	uint8_t        raw[16];
	ws_header     *hdr;

	ws = arg;

	d = ws->dialer;
	if ((rv = nni_aio_result(&ws->connaio)) != 0) {
		nni_mtx_lock(&ws->mtx);
		if ((uaio = ws->useraio) != NULL) {
			ws->useraio = NULL;
			nni_aio_finish_error(uaio, rv);
		}
		nni_mtx_unlock(&ws->mtx);
		nni_mtx_lock(&d->mtx);
		if (nni_list_node_active(&ws->node)) {
			nni_list_remove(&d->wspend, ws);
			ws->dialer = NULL;
			if (nni_list_empty(&d->wspend)) {
				nni_cv_wake(&d->cv);
			}
			nni_mtx_unlock(&d->mtx);
			ws_reap(ws);
		} else {
			nni_mtx_unlock(&d->mtx);
		}
		return;
	}

	ws->http = nni_aio_get_output(&ws->connaio, 0);
	nni_mtx_lock(&ws->mtx);
	uaio = ws->useraio;
	nni_aio_set_output(&ws->connaio, 0, NULL);
	if (uaio == NULL) {
		// This request was canceled for some reason.
		nni_mtx_unlock(&ws->mtx);
		ws_reap(ws);
		return;
	}

	for (int i = 0; i < 16; i++) {
		raw[i] = (uint8_t) nni_random();
	}
	nni_base64_encode(raw, 16, ws->keybuf, 24);
	ws->keybuf[24] = '\0';

	if ((rv = nni_http_set_uri(
	         ws->http, d->url->u_path, d->url->u_query)) != 0) {
		goto err;
	}

	nni_http_set_static_header(
	    ws->http, &ws->hdrs.connection, "Connection", "Upgrade");
	nni_http_set_static_header(
	    ws->http, &ws->hdrs.upgrade, "Upgrade", "websocket");
	nni_http_set_static_header(
	    ws->http, &ws->hdrs.wskey, "Sec-WebSocket-Key", ws->keybuf);
	nni_http_set_static_header(
	    ws->http, &ws->hdrs.wsversion, "Sec-WebSocket-Version", "13");

	if (d->proto != NULL) {
		nni_http_set_static_header(ws->http, &ws->hdrs.wsproto,
		    "Sec-WebSocket-Protocol", d->proto);
	}

	NNI_LIST_FOREACH (&d->headers, hdr) {
		if ((rv = nni_http_set_header(
		         ws->http, hdr->name, hdr->value)) != 0) {
			goto err;
		}
	}

	nni_http_write_req(ws->http, &ws->httpaio);
	nni_mtx_unlock(&ws->mtx);
	return;

err:
	nni_aio_finish_error(uaio, rv);
	nni_mtx_unlock(&ws->mtx);
	ws_reap(ws);
}